

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.h
# Opt level: O0

bool operator==(string *str,LLM_TN_IMPL *tn)

{
  __type _Var1;
  LLM_TN_IMPL *in_RDI;
  string local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  LLM_TN_IMPL::str_abi_cxx11_(in_RDI);
  _Var1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  return _Var1;
}

Assistant:

bool operator==(const std::string & str, const LLM_TN_IMPL & tn) {
        return str == tn.str();
    }